

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_create_info.cpp
# Opt level: O1

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateIndexInfo::Deserialize(CreateIndexInfo *this,Deserializer *deserializer)

{
  IndexConstraintType IVar1;
  uint uVar2;
  int iVar3;
  CreateIndexInfo *this_00;
  pointer pCVar4;
  pointer *__ptr;
  unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true> result;
  string str;
  _Head_base<0UL,_duckdb::CreateIndexInfo_*,_false> local_58;
  char *local_50;
  undefined8 local_48;
  char local_40 [16];
  
  this_00 = (CreateIndexInfo *)operator_new(0x240);
  CreateIndexInfo(this_00);
  local_58._M_head_impl = this_00;
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"name");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pCVar4->index_name,(string *)&local_50);
    if (local_50 != local_40) goto LAB_010a685b;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar4->index_name,(string *)&local_50);
    if (local_50 != local_40) {
LAB_010a685b:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"table");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pCVar4->table,(string *)&local_50);
    if (local_50 != local_40) goto LAB_010a68fa;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar4->table,(string *)&local_50);
    if (local_50 != local_40) {
LAB_010a68fa:
      operator_delete(local_50);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"index_type");
  if ((char)uVar2 != '\0') {
    if (deserializer->deserialize_enum_from_string == true) {
      (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
      EnumUtil::FromString<duckdb::DeprecatedIndexType>(local_50);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
    }
    else {
      (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_58);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xcb,"constraint_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    IVar1 = EnumUtil::FromString<duckdb::IndexConstraintType>(local_50);
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    IVar1 = (IndexConstraintType)iVar3;
  }
  pCVar4->constraint_type = IVar1;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,0xcc,"parsed_expressions",&pCVar4->parsed_expressions);
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (deserializer,0xcd,"scan_types",&pCVar4->scan_types);
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xce,"names",&pCVar4->names);
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_58);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (deserializer,0xcf,"column_ids",&pCVar4->column_ids);
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
            (deserializer,0xd0,"options",&pCVar4->options);
  pCVar4 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                       *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xd1,"index_type_name");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = '\0';
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pCVar4->index_type,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010a6b33;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pCVar4->index_type,(string *)&local_50);
    if (local_50 == local_40) goto LAB_010a6b33;
  }
  operator_delete(local_50);
LAB_010a6b33:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_CreateInfo).super_ParseInfo._vptr_ParseInfo = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateIndexInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CreateIndexInfo>(new CreateIndexInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "name", result->index_name);
	deserializer.ReadPropertyWithDefault<string>(201, "table", result->table);
	deserializer.ReadDeletedProperty<DeprecatedIndexType>(202, "index_type");
	deserializer.ReadProperty<IndexConstraintType>(203, "constraint_type", result->constraint_type);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(204, "parsed_expressions", result->parsed_expressions);
	deserializer.ReadPropertyWithDefault<vector<LogicalType>>(205, "scan_types", result->scan_types);
	deserializer.ReadPropertyWithDefault<vector<string>>(206, "names", result->names);
	deserializer.ReadPropertyWithDefault<vector<column_t>>(207, "column_ids", result->column_ids);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<Value>>(208, "options", result->options);
	deserializer.ReadPropertyWithDefault<string>(209, "index_type_name", result->index_type);
	return std::move(result);
}